

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall
QInputDialogDoubleSpinBox::keyPressEvent(QInputDialogDoubleSpinBox *this,QKeyEvent *event)

{
  bool bVar1;
  int iVar2;
  QKeyEvent *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QKeyEvent *in_stack_00000048;
  QAbstractSpinBox *in_stack_00000050;
  char *in_stack_ffffffffffffffb8;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QKeyEvent::key(in_RSI);
  if (iVar2 == 0x1000004) {
LAB_007a056c:
    bVar1 = QAbstractSpinBox::hasAcceptableInput((QAbstractSpinBox *)in_RDI);
    if (!bVar1) {
      QObject::property((char *)&local_28);
      QObject::setProperty(in_RDI,in_stack_ffffffffffffffb8,(QVariant *)0x7a05a6);
      ::QVariant::~QVariant(&local_28);
      goto LAB_007a05c1;
    }
  }
  else {
    iVar2 = QKeyEvent::key(in_RSI);
    if (iVar2 == 0x1000005) goto LAB_007a056c;
  }
  QAbstractSpinBox::keyPressEvent(in_stack_00000050,in_stack_00000048);
LAB_007a05c1:
  notifyTextChanged((QInputDialogDoubleSpinBox *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void keyPressEvent(QKeyEvent *event) override {
        if ((event->key() == Qt::Key_Return || event->key() == Qt::Key_Enter) && !hasAcceptableInput()) {
            setProperty("value", property("value"));
        } else {
            QDoubleSpinBox::keyPressEvent(event);
        }
        notifyTextChanged();
    }